

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

NumericConstant __thiscall
mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::MakeNumericConstant
          (BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> *this,
          double value)

{
  Impl *pIVar1;
  NumericConstant NVar2;
  Impl *in_XMM0_Qa;
  BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> *unaff_retaddr;
  Impl *impl;
  undefined8 in_stack_fffffffffffffff8;
  
  pIVar1 = Allocate<mp::NumericConstant>
                     (unaff_retaddr,(Kind)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                      (int)in_stack_fffffffffffffff8);
  pIVar1->value = (double)in_XMM0_Qa;
  NVar2 = internal::ExprBase::Create<mp::NumericConstant>(in_XMM0_Qa);
  return (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>)
         NVar2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_;
}

Assistant:

NumericConstant MakeNumericConstant(double value) {
    NumericConstant::Impl *impl = Allocate<NumericConstant>(expr::NUMBER);
    impl->value = value;
    return Expr::Create<NumericConstant>(impl);
  }